

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * upb_global_allocfunc(upb_alloc *alloc,void *ptr,size_t oldsize,size_t size)

{
  size_t size_local;
  size_t oldsize_local;
  void *ptr_local;
  upb_alloc *alloc_local;
  
  if (size == 0) {
    free(ptr);
    alloc_local = (upb_alloc *)0x0;
  }
  else {
    alloc_local = (upb_alloc *)realloc(ptr,size);
  }
  return alloc_local;
}

Assistant:

static void* upb_global_allocfunc(upb_alloc* alloc, void* ptr, size_t oldsize,
                                  size_t size) {
  UPB_UNUSED(alloc);
  UPB_UNUSED(oldsize);
  if (size == 0) {
    free(ptr);
    return NULL;
  } else {
    return realloc(ptr, size);
  }
}